

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduling_tests.hpp
# Opt level: O2

void test_parallel_group(void)

{
  element_type *this;
  int __val;
  string *hTask;
  test __t;
  __shared_ptr<oqpi::task<(oqpi::task_type)0,_oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,_oqpi::local_sync_object>,_oqpi::context_container<oqpi::task_base,_timer_task_context>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_H_EAL[P]oqpi_include_oqpi_scheduling_task_hpp:151:18)>,_(__gnu_cxx::_Lock_policy)2>
  local_c8;
  shared_ptr<oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>_>
  spFork;
  string local_a8;
  task_handle local_88;
  shared_ptr<oqpi::task<(oqpi::task_type)0,_oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,_oqpi::local_sync_object>,_oqpi::context_container<oqpi::task_base,_timer_task_context>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_H_EAL[P]oqpi_include_oqpi_scheduling_task_hpp:151:18)>_>
  spTask;
  string local_68;
  pointer local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_40 [2];
  
  test::test(&__t,"test_parallel_group");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"Fork",(allocator<char> *)&local_68);
  oqpi::
  helpers<oqpi::scheduler<concurrent_queue>,oqpi::context_container<oqpi::task_group_base,timer_group_context>,oqpi::context_container<oqpi::task_base,timer_task_context>,oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,oqpi::local_sync_object>>
  ::
  make_parallel_group<(oqpi::task_type)1,oqpi::context_container<oqpi::task_group_base,timer_group_context>>
            ((helpers<oqpi::scheduler<concurrent_queue>,oqpi::context_container<oqpi::task_group_base,timer_group_context>,oqpi::context_container<oqpi::task_base,timer_task_context>,oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,oqpi::local_sync_object>>
              *)&spFork,&local_a8,normal,gTaskCount,0);
  std::__cxx11::string::~string((string *)&local_a8);
  for (__val = 0; __val < gTaskCount; __val = __val + 1) {
    std::__cxx11::to_string(&local_68,__val);
    std::operator+(&local_a8,"FibonacciFork",&local_68);
    oqpi::
    helpers<oqpi::scheduler<concurrent_queue>,oqpi::context_container<oqpi::task_group_base,timer_group_context>,oqpi::context_container<oqpi::task_base,timer_task_context>,oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,oqpi::local_sync_object>>
    ::make_task_item<unsigned_long(&)(unsigned_long),unsigned_long_long_const&>
              ((helpers<oqpi::scheduler<concurrent_queue>,oqpi::context_container<oqpi::task_group_base,timer_group_context>,oqpi::context_container<oqpi::task_base,timer_task_context>,oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,oqpi::local_sync_object>>
                *)&spTask.
                   super___shared_ptr<oqpi::task<(oqpi::task_type)0,_oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,_oqpi::local_sync_object>,_oqpi::context_container<oqpi::task_base,_timer_task_context>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_H_EAL[P]oqpi_include_oqpi_scheduling_task_hpp:151:18)>,_(__gnu_cxx::_Lock_policy)2>
               ,&local_a8,fibonacci,&gValue);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_68);
    this = spFork.
           super___shared_ptr<oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
    std::
    __shared_ptr<oqpi::task<(oqpi::task_type)0,_oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,_oqpi::local_sync_object>,_oqpi::context_container<oqpi::task_base,_timer_task_context>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/H-EAL[P]oqpi/include/oqpi/scheduling/task.hpp:151:18)>,_(__gnu_cxx::_Lock_policy)2>
    ::__shared_ptr(&local_c8,
                   &spTask.
                    super___shared_ptr<oqpi::task<(oqpi::task_type)0,_oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,_oqpi::local_sync_object>,_oqpi::context_container<oqpi::task_base,_timer_task_context>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_H_EAL[P]oqpi_include_oqpi_scheduling_task_hpp:151:18)>,_(__gnu_cxx::_Lock_policy)2>
                  );
    local_88.spTask_.super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &(local_c8._M_ptr)->super_task_base;
    local_88.spTask_.super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = local_c8._M_refcount._M_pi;
    local_c8._M_ptr = (element_type *)0x0;
    local_c8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    oqpi::
    task_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
    ::addTask(&this->
               super_task_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
              ,&local_88);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_88.spTask_.super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c8._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&spTask.
                super___shared_ptr<oqpi::task<(oqpi::task_type)0,_oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,_oqpi::local_sync_object>,_oqpi::context_container<oqpi::task_base,_timer_task_context>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_H_EAL[P]oqpi_include_oqpi_scheduling_task_hpp:151:18)>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
  }
  std::__shared_ptr<oqpi::task_base,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,(oqpi::task_type)1,oqpi::context_container<oqpi::task_group_base,timer_group_context>>,void>
            ((__shared_ptr<oqpi::task_base,(__gnu_cxx::_Lock_policy)2> *)&local_48,
             &spFork.
              super___shared_ptr<oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>,_(__gnu_cxx::_Lock_policy)2>
            );
  local_68._M_dataplus._M_p = local_48;
  local_68._M_string_length = (size_type)a_Stack_40[0]._M_pi;
  local_48 = (pointer)0x0;
  a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  hTask = &local_68;
  oqpi::
  helpers<oqpi::scheduler<concurrent_queue>,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>,_oqpi::context_container<oqpi::task_base,_timer_task_context>,_oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,_oqpi::local_sync_object>_>
  ::schedule_task((helpers<oqpi::scheduler<concurrent_queue>,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>,_oqpi::context_container<oqpi::task_base,_timer_task_context>,_oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,_oqpi::local_sync_object>_>
                   *)&local_a8,(task_handle *)hTask);
  oqpi::task_handle::wait((task_handle *)&local_a8,hTask);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_a8._M_string_length);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_68._M_string_length);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&spFork.
              super___shared_ptr<oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  test::~test(&__t);
  return;
}

Assistant:

void test_parallel_group()
{
    TEST_FUNC;

    auto spFork = oqpi_tk::make_parallel_group<oqpi::task_type::waitable>("Fork", oqpi::task_priority::normal, gTaskCount);
    for (auto i = 0; i < gTaskCount; ++i)
    {
        auto spTask = oqpi_tk::make_task_item("FibonacciFork" + std::to_string(i), fibonacci, gValue);
        spFork->addTask(spTask);
    }
    oqpi_tk::schedule_task(oqpi::task_handle(spFork)).wait();
}